

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_tests.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
* evaluation_speed_test_abi_cxx11_
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             *__return_storage_ptr__,ChebyshevExpansion *cee,vectype *xpts,long N)

{
  _Rb_tree_header *p_Var1;
  double *pdVar2;
  Index IVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *pmVar4;
  long lVar5;
  mapped_type *pmVar6;
  CoeffReturnType pdVar7;
  Scalar *pSVar8;
  long lVar9;
  Index IVar10;
  ulong uVar11;
  int i;
  bool bVar12;
  vectype ypts;
  allocator<char> local_89;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *local_78;
  ChebyshevExpansion local_70;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88.m_storage.m_data = (double *)0x0;
  local_88.m_storage.m_rows = 0;
  local_78 = __return_storage_ptr__;
  lVar5 = std::chrono::_V2::system_clock::now();
  lVar9 = 0;
  if (0 < N) {
    lVar9 = N;
  }
  local_70.m_recurrence_buffer.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = lVar9;
  while (bVar12 = lVar9 != 0, lVar9 = lVar9 + -1, bVar12) {
    ChebTools::ChebyshevExpansion::y_recurrence_xscaled(&local_70,&cee->m_c);
    IVar10 = local_88.m_storage.m_rows;
    pdVar2 = local_88.m_storage.m_data;
    local_88.m_storage.m_data =
         local_70.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data;
    local_88.m_storage.m_rows =
         local_70.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows;
    local_70.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar2;
    local_70.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         IVar10;
    free(pdVar2);
  }
  lVar9 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"recurrence[vector]",&local_89);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](local_78,(key_type *)&local_70);
  local_70.m_recurrence_buffer.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)(double)N;
  *pmVar6 = (((double)(lVar9 - lVar5) / 1000000000.0) /
            (double)local_70.m_recurrence_buffer.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
            * 1000000.0;
  std::__cxx11::string::~string((string *)&local_70);
  lVar9 = std::chrono::_V2::system_clock::now();
  IVar10 = local_70.m_recurrence_buffer.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  while (bVar12 = IVar10 != 0, IVar10 = IVar10 + -1, bVar12) {
    ChebTools::ChebyshevExpansion::y_Clenshaw_xscaled(&local_70,&cee->m_c);
    IVar3 = local_88.m_storage.m_rows;
    pdVar2 = local_88.m_storage.m_data;
    local_88.m_storage.m_data =
         local_70.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data;
    local_88.m_storage.m_rows =
         local_70.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows;
    local_70.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar2;
    local_70.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         IVar3;
    free(pdVar2);
  }
  lVar5 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Clenshaw[vector]",&local_89);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](local_78,(key_type *)&local_70);
  *pmVar6 = (((double)(lVar5 - lVar9) / 1000000000.0) /
            (double)local_70.m_recurrence_buffer.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
            * 1000000.0;
  std::__cxx11::string::~string((string *)&local_70);
  lVar9 = std::chrono::_V2::system_clock::now();
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_88,
             (xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
            );
  for (lVar5 = 0;
      lVar5 != local_70.m_recurrence_buffer.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      lVar5 = lVar5 + 1) {
    uVar11 = (ulong)(uint)(xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_rows;
    while (0 < (int)uVar11) {
      uVar11 = uVar11 - 1;
      pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)xpts,uVar11)
      ;
      local_70.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data = (double *)ChebTools::ChebyshevExpansion::y_recurrence(cee,*pdVar7);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_88,
                          uVar11);
      *pSVar8 = (Scalar)local_70.m_nodal_value_cache.
                        super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
    }
  }
  lVar5 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"recurrence[1x1]",&local_89);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](local_78,(key_type *)&local_70);
  *pmVar6 = (((double)(lVar5 - lVar9) / 1000000000.0) /
            (double)local_70.m_recurrence_buffer.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
            * 1000000.0;
  std::__cxx11::string::~string((string *)&local_70);
  local_70.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = std::chrono::_V2::system_clock::now();
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_88,
             (xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
            );
  for (lVar9 = 0;
      lVar9 != local_70.m_recurrence_buffer.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      lVar9 = lVar9 + 1) {
    uVar11 = (ulong)(uint)(xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_rows;
    while (0 < (int)uVar11) {
      uVar11 = uVar11 - 1;
      pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)xpts,uVar11)
      ;
      local_70.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data = (double *)ChebTools::ChebyshevExpansion::y_Clenshaw(cee,*pdVar7);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_88,
                          uVar11);
      *pSVar8 = (Scalar)local_70.m_nodal_value_cache.
                        super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
    }
  }
  lVar9 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Clenshaw[1x1]",&local_89);
  pmVar4 = local_78;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](local_78,(key_type *)&local_70);
  *pmVar6 = (((double)(lVar9 - local_70.m_nodal_value_cache.
                               super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows) / 1000000000.0) /
            (double)local_70.m_recurrence_buffer.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
            * 1000000.0;
  std::__cxx11::string::~string((string *)&local_70);
  free(local_88.m_storage.m_data);
  return pmVar4;
}

Assistant:

std::map<std::string, double> evaluation_speed_test(ChebyshevExpansion &cee, const vectype &xpts, long N) {
    std::map<std::string, double> output;
    vectype ypts;

    auto startTime = std::chrono::system_clock::now();
    for (int i = 0; i < N; ++i) {
        ypts = cee.y_recurrence_xscaled(xpts);
    }
    auto endTime = std::chrono::system_clock::now();
    auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["recurrence[vector]"] = elap_us;

    startTime = std::chrono::system_clock::now();
    for (int i = 0; i < N; ++i) {
        ypts = cee.y_Clenshaw_xscaled(xpts);
    }
    endTime = std::chrono::system_clock::now();
    elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["Clenshaw[vector]"] = elap_us;

    startTime = std::chrono::system_clock::now();
    ypts.resize(xpts.size());
    for (int i = 0; i < N; ++i) {
        for (int n = static_cast<int>(xpts.size()) - 1; n >= 0; --n) {
            ypts(n) = cee.y_recurrence(xpts(n));
        }
    }
    endTime = std::chrono::system_clock::now();
    elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["recurrence[1x1]"] = elap_us;

    startTime = std::chrono::system_clock::now();
    ypts.resize(xpts.size());
    for (int i = 0; i < N; ++i) {
        for (int n = static_cast<int>(xpts.size()) - 1; n >= 0; --n) {
            ypts(n) = cee.y_Clenshaw(xpts(n));
        }
    }
    endTime = std::chrono::system_clock::now();
    elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["Clenshaw[1x1]"] = elap_us;
    return output;
}